

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping.cpp
# Opt level: O3

void test_2d_static<1ul,1ul,1ul,1ul>(void)

{
  value_type true_idx;
  int dptr [1];
  unsigned_long local_50;
  int local_44;
  int *local_40;
  int *local_38;
  
  local_50 = CONCAT71(local_50._1_7_,1);
  local_40 = (int *)CONCAT71(local_40._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xb7,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",(bool *)&local_50,
             (bool *)&local_40);
  local_50 = 1;
  local_40._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xb9,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&local_50,
             (int *)&local_40);
  local_50 = 1;
  local_40 = (int *)CONCAT44(local_40._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xba,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&local_50,
             (int *)&local_40);
  local_50 = 1;
  local_40 = (int *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xbc,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&local_50,
             (unsigned_long *)&local_40);
  local_50 = 1;
  local_40 = (int *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xbd,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&local_50,
             (unsigned_long *)&local_40);
  local_50 = CONCAT71(local_50._1_7_,1);
  local_40 = (int *)CONCAT71(local_40._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc3,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",(bool *)&local_50,
             (bool *)&local_40);
  local_50 = 1;
  local_40 = (int *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc5,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&local_50,
             (unsigned_long *)&local_40);
  local_50 = 1;
  local_40 = (int *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","M",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc6,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&local_50,
             (unsigned_long *)&local_40);
  local_50 = 1;
  local_40 = (int *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / N) * (Y / M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,200,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&local_50,
             (unsigned_long *)&local_40);
  local_50 = 1;
  local_40 = (int *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc9,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&local_50,
             (unsigned_long *)&local_40);
  local_50 = 0;
  local_40 = (int *)0x0;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.index(i, j))","true_idx",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xd3,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",
             (unsigned_long *)&local_40,&local_50);
  local_38 = &local_44 + local_50;
  local_40 = &local_44;
  boost::detail::test_eq_impl<int*,int*>
            ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xd5,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&local_40,&local_38)
  ;
  local_44 = 0x2a;
  local_40 = (int *)CONCAT44(local_40._4_4_,0x2a);
  boost::detail::test_eq_impl<int,int>
            ("(dptr[l.index(i, j)])","42",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xd9,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&local_44,
             (int *)&local_40);
  local_50 = 0;
  local_40 = (int *)0x0;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.index(i, j))","true_idx",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xe3,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",
             (unsigned_long *)&local_40,&local_50);
  local_38 = &local_44 + local_50;
  local_40 = &local_44;
  boost::detail::test_eq_impl<int*,int*>
            ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xe5,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&local_40,&local_38)
  ;
  local_44 = 0x11;
  local_40 = (int *)CONCAT44(local_40._4_4_,0x11);
  boost::detail::test_eq_impl<int,int>
            ("(dptr[sub_l.index(i, j)])","17",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xe9,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&local_44,
             (int *)&local_40);
  local_50 = 0;
  local_40 = (int *)0x0;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.index(i, j))","true_idx",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xf2,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",
             (unsigned_long *)&local_40,&local_50);
  local_40 = (int *)CONCAT44(local_40._4_4_,0x11);
  boost::detail::test_eq_impl<int,int>
            ("(dptr[l.index(i, j)])","17",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xf9,"void test_2d_static() [N = 1UL, M = 1UL, X = 1UL, Y = 1UL]",&local_44,
             (int *)&local_40);
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");
    static_assert(0 == (Y % M), "Y must be divisable by M");

    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<0, 0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    layout_mapping_right<
        dimensions<X / N, Y / M>, dimensions<N, M>, dimensions<0, 0> 
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);
    BOOST_TEST_EQ((sub_l.stride(1)), M);

    BOOST_TEST_EQ((sub_l.size()), (X / N) * (Y / M));
    BOOST_TEST_EQ((sub_l.span()), X * Y);

    int dptr[X * Y];

    // Set all elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set every (Nth, Mth) element to 17.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.stepping();
        auto const true_idx = (sub_l[1] * s[1]) * (s[0] * i) + (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 17);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // Element in the strided sub-box.
        if (  (0 == (i % sub_l.stepping()[0]))
           && (0 == (j % sub_l.stepping()[1]))
           )
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}